

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5s.hpp
# Opt level: O0

void __thiscall trng::yarn5s::step(yarn5s *this)

{
  int32_t iVar1;
  long in_RDI;
  uint64_t t;
  
  *(undefined4 *)(in_RDI + 0x24) = *(undefined4 *)(in_RDI + 0x20);
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RDI + 0x1c);
  *(undefined4 *)(in_RDI + 0x1c) = *(undefined4 *)(in_RDI + 0x18);
  *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RDI + 0x14);
  iVar1 = int_math::modulo<2147461007,5>(0x10c4f3);
  *(int32_t *)(in_RDI + 0x14) = iVar1;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn5s::step() {
    uint64_t t{static_cast<uint64_t>(P.a[0]) * static_cast<uint64_t>(S.r[0]) +
               static_cast<uint64_t>(P.a[1]) * static_cast<uint64_t>(S.r[1]) +
               static_cast<uint64_t>(P.a[2]) * static_cast<uint64_t>(S.r[2]) +
               static_cast<uint64_t>(P.a[3]) * static_cast<uint64_t>(S.r[3])};
    if (t >= static_cast<uint64_t>(2u) * modulus * modulus)
      t -= static_cast<uint64_t>(2u) * modulus * modulus;
    t += static_cast<uint64_t>(P.a[4]) * static_cast<uint64_t>(S.r[4]);
    S.r[4] = S.r[3];
    S.r[3] = S.r[2];
    S.r[2] = S.r[1];
    S.r[1] = S.r[0];
    S.r[0] = int_math::modulo<modulus, 5>(t);
  }